

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho_corasick.cpp
# Opt level: O2

void __thiscall Trie::createChild(Trie *this,char c)

{
  pointer ppTVar1;
  ulong uVar2;
  value_type local_38;
  
  uVar2 = ~(-1L << (c + 0x9fU & 0x3f)) & this->bitmask;
  uVar2 = uVar2 - (uVar2 >> 1 & 0x1555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  ppTVar1 = (this->sons).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = (value_type)operator_new(0x40);
  local_38->bitmask = 0;
  (local_38->sons).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_38->sons).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_38->sons).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38->end_of = -1;
  local_38->back = (Trie *)0x0;
  local_38->output = (Trie *)0x0;
  local_38->letter = c;
  std::vector<Trie_*,_std::allocator<Trie_*>_>::_M_insert_rval
            (&this->sons,
             (const_iterator)
             (ppTVar1 + (((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)),
             &local_38);
  this->bitmask = this->bitmask | 1L << (c + 0x9fU & 0x3f);
  return;
}

Assistant:

inline void createChild(char c) {
		sons.insert(sons.begin() + childIndex(c), new Trie(c));  // maintain ordering
		bitmask |= (1LL << normalize(c));
	}